

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O0

void Abc_FrameCheckPoConstTest(Abc_Frame_t *p)

{
  int iVar1;
  uint uVar2;
  uint local_1c;
  int i;
  Abc_Obj_t *pObj;
  Abc_Frame_t *p_local;
  
  for (local_1c = 0; iVar1 = Abc_NtkPoNum(p->pNtkCur), (int)local_1c < iVar1;
      local_1c = local_1c + 1) {
    Abc_NtkPo(p->pNtkCur,local_1c);
    uVar2 = Abc_FrameCheckPoConst(p,local_1c);
    printf("%d = %d\n",(ulong)local_1c,(ulong)uVar2);
  }
  return;
}

Assistant:

void Abc_FrameCheckPoConstTest( Abc_Frame_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachPo( p->pNtkCur, pObj, i )
        printf( "%d = %d\n", i, Abc_FrameCheckPoConst(p, i) );
}